

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl(HttpInputStreamImpl *this)

{
  HttpInputStreamImpl *this_local;
  
  Promise<void>::~Promise(&this->messageReadQueue);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->onMessageDone);
  Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_>::~Maybe
            (&this->resumingRequest);
  HttpHeaders::~HttpHeaders(&this->headers);
  Array<char>::~Array(&this->headerBuffer);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::~WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>);
  return;
}

Assistant:

static kj::OneOf<HttpHeaders::Request, HttpHeaders::ConnectRequest> getResumingRequest(
      kj::OneOf<HttpMethod, HttpConnectMethod> method,
      kj::StringPtr url) {
    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        return HttpHeaders::Request { m, url };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        return HttpHeaders::ConnectRequest { url };
      }
    }
    KJ_UNREACHABLE;
  }